

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int ref_nonsingle(saucy *s,coloring *c,int *adj,int *edg,int cf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  
  lVar5 = (long)cf;
  iVar4 = c->clen[lVar5];
  lVar7 = (long)iVar4;
  if (lVar7 != 0) {
    memcpy(s->junk,c->lab + lVar5,lVar7 * 4 + 4);
    for (lVar6 = 0; lVar6 <= lVar7; lVar6 = lVar6 + 1) {
      iVar3 = s->junk[lVar6];
      uVar9 = (ulong)adj[iVar3];
      piVar8 = edg + uVar9;
      for (; (int)uVar9 != adj[(long)iVar3 + 1]; uVar9 = (ulong)((int)uVar9 + 1)) {
        iVar1 = *piVar8;
        if ((c->clen[c->cfront[iVar1]] != 0) &&
           (iVar2 = s->ccount[iVar1], s->ccount[iVar1] = iVar2 + 1, iVar2 == 0)) {
          move_to_back(s,c,iVar1);
        }
        piVar8 = piVar8 + 1;
      }
    }
    iVar3 = refine_cell(s,c,ref_nonsingle_cell);
    for (; lVar5 <= cf + iVar4; lVar5 = lVar5 + 1) {
      iVar1 = c->lab[lVar5];
      uVar9 = (ulong)adj[iVar1];
      piVar8 = edg + uVar9;
      for (; (int)uVar9 != adj[(long)iVar1 + 1]; uVar9 = (ulong)((int)uVar9 + 1)) {
        s->ccount[*piVar8] = 0;
        piVar8 = piVar8 + 1;
      }
    }
    return iVar3;
  }
  iVar4 = ref_singleton(s,c,adj,edg,cf);
  return iVar4;
}

Assistant:

static int
ref_nonsingle(struct saucy *s, struct coloring *c,
    const int *adj, const int *edg, int cf)
{
    int i, j, k, ret;
    const int cb = cf + c->clen[cf];
    const int size = cb - cf + 1;

    /* Double check for nonsingles which became singles later */
    if (cf == cb) {
        return ref_singleton(s, c, adj, edg, cf);
    }

    /* Establish connected list */
    memcpy(s->junk, c->lab + cf, size * sizeof(int));
    for (i = 0; i < size; ++i) {
        k = s->junk[i];
        for (j = adj[k]; j != adj[k+1]; ++j) {
            data_count(s, c, edg[j]);
        }
    }

    /* Refine the cells we're connected to */
    ret = refine_cell(s, c, ref_nonsingle_cell);

    /* Clear the counts; use lab because junk was overwritten */
    for (i = cf; i <= cb; ++i) {
        k = c->lab[i];
        for (j = adj[k]; j != adj[k+1]; ++j) {
            s->ccount[edg[j]] = 0;
        }
    }

    return ret;
}